

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)400>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  GLMClassifier_PostEvaluationTransform GVar2;
  GLMClassifier_ClassEncoding GVar3;
  int iVar4;
  int iVar5;
  ClassLabelsCase CVar6;
  ModelDescription *from;
  GLMClassifier *pGVar7;
  CoreML *this;
  Int64Vector *this_00;
  StringVector *this_01;
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> *other;
  GLMClassifier_DoubleArray *pGVar8;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *features;
  ValidationPolicy *in_stack_fffffffffffffba8;
  allocator<char> *__a;
  allocator<char> local_321;
  string local_320;
  int local_300;
  allocator<char> local_2f9;
  int i;
  undefined1 local_2d8 [8];
  RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray> weights;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  int local_220;
  allocator<char> local_219;
  int numClasses;
  allocator<char> local_1f1;
  string local_1f0;
  int local_1d0;
  allocator<char> local_1c9;
  int numCoefficient;
  allocator<char> local_1a1;
  string local_1a0;
  undefined1 local_180 [8];
  GLMClassifier glmClassifier;
  ValidationPolicy local_100 [4];
  undefined1 local_f0 [8];
  Result result;
  ModelDescription interface;
  Model *format_local;
  
  from = Specification::Model::description(format);
  Specification::ModelDescription::ModelDescription
            ((ModelDescription *)((long)&result.m_message.field_2 + 8),from);
  pGVar7 = Specification::Model::glmclassifier(format);
  ValidationPolicy::ValidationPolicy(local_100);
  validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::GLMClassifier>
            ((Result *)local_f0,(CoreML *)format,(Model *)pGVar7,(GLMClassifier *)0x0,false,false,
             in_stack_fffffffffffffba8);
  bVar1 = Result::good((Result *)local_f0);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_f0);
    goto LAB_00437649;
  }
  this = (CoreML *)
         Specification::ModelDescription::input
                   ((ModelDescription *)((long)&result.m_message.field_2 + 8));
  validateDescriptionsAreAllVectorizableTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)&glmClassifier._cached_size_,this,features);
  Result::operator=((Result *)local_f0,(Result *)&glmClassifier._cached_size_);
  Result::~Result((Result *)&glmClassifier._cached_size_);
  bVar1 = Result::good((Result *)local_f0);
  if (!bVar1) {
    Result::Result(__return_storage_ptr__,(Result *)local_f0);
    goto LAB_00437649;
  }
  pGVar7 = Specification::Model::glmclassifier(format);
  Specification::GLMClassifier::GLMClassifier((GLMClassifier *)local_180,pGVar7);
  GVar2 = Specification::GLMClassifier::postevaluationtransform((GLMClassifier *)local_180);
  if ((GVar2 == GLMClassifier_PostEvaluationTransform_Logit) ||
     (GVar2 = Specification::GLMClassifier::postevaluationtransform((GLMClassifier *)local_180),
     GVar2 == GLMClassifier_PostEvaluationTransform_Probit)) {
    GVar3 = Specification::GLMClassifier::classencoding((GLMClassifier *)local_180);
    if ((GVar3 == GLMClassifier_ClassEncoding_ReferenceClass) ||
       (GVar3 = Specification::GLMClassifier::classencoding((GLMClassifier *)local_180),
       GVar3 == GLMClassifier_ClassEncoding_OneVsRest)) {
      iVar4 = Specification::GLMClassifier::weights_size((GLMClassifier *)local_180);
      local_1d0 = iVar4;
      if (iVar4 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,
                   "The number of DoubleArrays in weights must be greater than zero",&local_1f1);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
      }
      else {
        iVar5 = Specification::GLMClassifier::offset_size((GLMClassifier *)local_180);
        if (iVar4 == iVar5) {
          CVar6 = Specification::GLMClassifier::ClassLabels_case((GLMClassifier *)local_180);
          if (CVar6 == CLASSLABELS_NOT_SET) {
            local_220 = -1;
          }
          else if (CVar6 == kStringClassLabels) {
            this_01 = Specification::GLMClassifier::stringclasslabels((GLMClassifier *)local_180);
            local_220 = Specification::StringVector::vector_size(this_01);
          }
          else if (CVar6 == kInt64ClassLabels) {
            this_00 = Specification::GLMClassifier::int64classlabels((GLMClassifier *)local_180);
            local_220 = Specification::Int64Vector::vector_size(this_00);
          }
          GVar3 = Specification::GLMClassifier::classencoding((GLMClassifier *)local_180);
          if (GVar3 == GLMClassifier_ClassEncoding_ReferenceClass) {
            if ((local_220 == -1) || (local_1d0 == local_220 + -1)) goto LAB_00437279;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_240,
                       "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes"
                       ,&local_241);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_240);
            std::__cxx11::string::~string((string *)&local_240);
            std::allocator<char>::~allocator(&local_241);
          }
          else if (local_220 == 2) {
            if (local_1d0 == 1) {
LAB_00437279:
              if ((local_220 < 3) ||
                 (GVar2 = Specification::GLMClassifier::postevaluationtransform
                                    ((GLMClassifier *)local_180),
                 GVar2 != GLMClassifier_PostEvaluationTransform_Probit)) {
                other = Specification::GLMClassifier::weights((GLMClassifier *)local_180);
                google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                ::RepeatedPtrField((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                    *)local_2d8,other);
                pGVar8 = google::protobuf::
                         RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
                         operator[]((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                     *)local_2d8,0);
                iVar4 = Specification::GLMClassifier_DoubleArray::value_size(pGVar8);
                if (iVar4 == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&i,"Weight DoubleArrays must have nonzero length",&local_2f9)
                  ;
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&i);
                  std::__cxx11::string::~string((string *)&i);
                  std::allocator<char>::~allocator(&local_2f9);
                }
                else {
                  for (local_300 = 1; iVar4 = local_300,
                      iVar5 = google::protobuf::
                              RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
                              size((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                    *)local_2d8), iVar4 < iVar5; local_300 = local_300 + 1) {
                    pGVar8 = google::protobuf::
                             RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
                             operator[]((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                         *)local_2d8,0);
                    iVar4 = Specification::GLMClassifier_DoubleArray::value_size(pGVar8);
                    pGVar8 = google::protobuf::
                             RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::
                             operator[]((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                         *)local_2d8,local_300);
                    iVar5 = Specification::GLMClassifier_DoubleArray::value_size(pGVar8);
                    if (iVar4 != iVar5) {
                      __a = &local_321;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_320,
                                 "Weight DoubleArrays must have the same length",__a);
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_320);
                      std::__cxx11::string::~string((string *)&local_320);
                      std::allocator<char>::~allocator(&local_321);
                      goto LAB_00437611;
                    }
                  }
                  Result::Result(__return_storage_ptr__);
                }
LAB_00437611:
                google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                ::~RepeatedPtrField((RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>
                                     *)local_2d8);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2b8,
                           "Probit post evaluation transform is only supported for binary classification"
                           ,(allocator<char> *)((long)&weights.super_RepeatedPtrFieldBase.rep_ + 7))
                ;
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_2b8);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::allocator<char>::~allocator
                          ((allocator<char> *)((long)&weights.super_RepeatedPtrFieldBase.rep_ + 7));
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_268,
                         "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one"
                         ,&local_269);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_268);
              std::__cxx11::string::~string((string *)&local_268);
              std::allocator<char>::~allocator(&local_269);
            }
          }
          else {
            if ((local_220 == -1) || (local_1d0 == local_220)) goto LAB_00437279;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_290,
                       "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes"
                       ,&local_291);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_290);
            std::__cxx11::string::~string((string *)&local_290);
            std::allocator<char>::~allocator(&local_291);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&numClasses,
                     "The number of DoubleArrays in weights must match number of offsets",&local_219
                    );
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&numClasses);
          std::__cxx11::string::~string((string *)&numClasses);
          std::allocator<char>::~allocator(&local_219);
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&numCoefficient,"Invalid class encoding",&local_1c9);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&numCoefficient);
      std::__cxx11::string::~string((string *)&numCoefficient);
      std::allocator<char>::~allocator(&local_1c9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,"Invalid post evaluation transform",&local_1a1);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
  }
  Specification::GLMClassifier::~GLMClassifier((GLMClassifier *)local_180);
LAB_00437649:
  Result::~Result((Result *)local_f0);
  Specification::ModelDescription::~ModelDescription
            ((ModelDescription *)((long)&result.m_message.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmClassifier>(const Specification::Model& format) {

        // Check has a classifier interface
        Specification::ModelDescription interface = format.description();
        Result result = validateClassifierInterface(format, format.glmclassifier());
        if (!result.good()) {
            return result;
        }
        
        // Check that inputs are vectorizable
        result = validateDescriptionsAreAllVectorizableTypes(interface.input());
        if (!result.good()) {
            return result;
        }

        Specification::GLMClassifier glmClassifier = format.glmclassifier();

        // Check PostEvluationTransfrom and ClassEncoding have allowed values
        if(glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Logit
           && glmClassifier.postevaluationtransform() != Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid post evaluation transform");
        }
        if(glmClassifier.classencoding() != Specification::GLMClassifier::ReferenceClass
           && glmClassifier.classencoding() != Specification::GLMClassifier::OneVsRest) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Invalid class encoding");
        }

        // Check has weights and same size as offsets
        int numCoefficient = glmClassifier.weights_size();
        if(numCoefficient == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must be greater than zero");
        }
        if(numCoefficient != glmClassifier.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "The number of DoubleArrays in weights must match number of offsets");
        }

        // Check number of weight vector makes sense based on the number of classes and the class encoding
        int numClasses;
        switch (glmClassifier.ClassLabels_case()) {
            case Specification::GLMClassifier::kInt64ClassLabels:
                numClasses = glmClassifier.int64classlabels().vector_size();
                break;
            case Specification::GLMClassifier::kStringClassLabels:
                numClasses = glmClassifier.stringclasslabels().vector_size();
                break;
            case Specification::GLMClassifier::CLASSLABELS_NOT_SET:
                numClasses = -1;
                break;
        }
        if(glmClassifier.classencoding() == Specification::GLMClassifier::ReferenceClass) {
            if (numClasses != -1 && numCoefficient != numClasses - 1) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "With ReferenceClass encoding the number of DoubleArrays in weights must be one less than number of classes");
            }
        } else { // One vs Rest encoding
            if(numClasses == 2) {
                if(numCoefficient != 1) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "When using OneVsRest encoding for only two classes, the number of DoubleArrays in weights must be one");
                }
            } else if (numClasses != -1 && numCoefficient != numClasses) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "With OneVsRest encoding the number of DoubleArrays in weights must equal the number of classes");
            }
        }

        // Probit is only supported for binary classification
        if(numClasses > 2 && glmClassifier.postevaluationtransform() == Specification::GLMClassifier::Probit) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Probit post evaluation transform is only supported for binary classification");
        }

        // Check all DoubleArrays in weights have the same, nonzero length
        auto weights = glmClassifier.weights();
        if(weights[0].value_size() == 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have nonzero length");
        }
        for(int i = 1; i < weights.size(); i++) {
            if(weights[0].value_size() != weights[i].value_size()) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Weight DoubleArrays must have the same length");
            }
        }

        return Result();
    }